

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readgamma.hpp
# Opt level: O1

vector<TensorEntry,_std::allocator<TensorEntry>_> *
readGamma(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,int n)

{
  pointer *ppTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  iterator __position;
  pointer pTVar5;
  uint uVar6;
  char cVar7;
  long *plVar8;
  istream *piVar9;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  uint uVar13;
  size_type *psVar14;
  ulong uVar15;
  uint __val;
  uint __len;
  float fVar16;
  TensorEntry entry;
  string line;
  string __str;
  ifstream sparsefile;
  TensorEntry local_2a4;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [32];
  string local_258;
  long local_238 [65];
  
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298 = local_288;
  local_290 = 0;
  local_288[0] = 0;
  __val = -n;
  if (0 < n) {
    __val = n;
  }
  __len = 1;
  if (9 < __val) {
    uVar15 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar13 = (uint)uVar15;
      if (uVar13 < 100) {
        __len = __len - 2;
        goto LAB_0015908d;
      }
      if (uVar13 < 1000) {
        __len = __len - 1;
        goto LAB_0015908d;
      }
      if (uVar13 < 10000) goto LAB_0015908d;
      uVar15 = uVar15 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar13);
    __len = __len + 1;
  }
LAB_0015908d:
  local_278._0_8_ = (pointer)(local_278 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_278,(char)__len - (char)(n >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((_Alloc_hider *)local_278._0_8_)->_M_p + (ulong)((uint)n >> 0x1f)),
             __len,__val);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x1999d9);
  paVar2 = &local_258.field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_258.field_2._M_allocated_capacity = *psVar14;
    local_258.field_2._8_8_ = plVar8[3];
    local_258._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar14;
    local_258._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_258._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ifstream::ifstream((istream *)local_238,(string *)&local_258,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_);
  }
  while( true ) {
    cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_298,cVar7);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_238);
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_298);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_278,&local_258,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    pcVar4 = ((_Alloc_hider *)local_278._0_8_)->_M_p;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar4,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar4) break;
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00159428;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    local_2a4.a = (short)lVar11;
    pcVar4 = (((pointer)(local_278._0_8_ + 0x20))->_M_dataplus)._M_p;
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar4,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar4) {
LAB_00159404:
      std::__throw_invalid_argument("stoi");
LAB_00159410:
      std::__throw_out_of_range("stoi");
      break;
    }
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00159410;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    local_2a4.b = (short)lVar11;
    pcVar4 = (((pointer)(local_278._0_8_ + 0x40))->_M_dataplus)._M_p;
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar4,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar4) {
      std::__throw_invalid_argument("stoi");
      goto LAB_00159404;
    }
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00159434;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    local_2a4.c = (short)lVar11;
    pcVar4 = (((pointer)(local_278._0_8_ + 0x60))->_M_dataplus)._M_p;
    iVar3 = *piVar10;
    *piVar10 = 0;
    fVar16 = strtof(pcVar4,(char **)&local_258);
    if (local_258._M_dataplus._M_p == pcVar4) goto LAB_00159440;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    else if (*piVar10 == 0x22) goto LAB_0015944c;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_2a4.val = fVar16;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<TensorEntry,std::allocator<TensorEntry>>::_M_realloc_insert<TensorEntry_const&>
                ((vector<TensorEntry,std::allocator<TensorEntry>> *)__return_storage_ptr__,
                 __position,&local_2a4);
    }
    else {
      (__position._M_current)->val = fVar16;
      (__position._M_current)->a = local_2a4.a;
      (__position._M_current)->b = local_2a4.b;
      (__position._M_current)->c = local_2a4.c;
      *(undefined2 *)&(__position._M_current)->field_0x6 = local_2a4._6_2_;
      ppTVar1 = &(__return_storage_ptr__->
                 super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278);
  }
  std::__throw_invalid_argument("stoi");
LAB_00159428:
  std::__throw_out_of_range("stoi");
LAB_00159434:
  std::__throw_out_of_range("stoi");
LAB_00159440:
  std::__throw_invalid_argument("stof");
LAB_0015944c:
  uVar12 = std::__throw_out_of_range("stof");
  std::ifstream::~ifstream(local_238);
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  pTVar5 = (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar5 != (pointer)0x0) {
    operator_delete(pTVar5);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

static std::vector<TensorEntry> readGamma(int n)
{
    std::vector<TensorEntry> sparsegamma;
    std::string line;
    std::ifstream sparsefile("../gamma/sparse" + std::to_string(n));
    TensorEntry entry;
    while(getline(sparsefile, line))
    {
        std::vector<std::string> tokens = split(line.substr(1, line.length() - 3), ',');
        entry.a = std::stoi(tokens[0]);
        entry.b = std::stoi(tokens[1]);
        entry.c = std::stoi(tokens[2]);
        entry.val = std::stof(tokens[3]);
        sparsegamma.push_back(entry);
    }
    sparsefile.close();
    return sparsegamma;
}